

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_swap.c
# Opt level: O0

void ref_swap_tattle_nodes(REF_CELL ref_cell,REF_INT node0,REF_INT node1)

{
  uint local_34;
  uint local_30;
  int local_2c;
  int local_28;
  uint local_24;
  REF_INT cell_node2;
  REF_INT cell;
  REF_INT cell_node;
  REF_INT item;
  REF_INT node1_local;
  REF_INT node0_local;
  REF_CELL ref_cell_local;
  
  if ((node0 < 0) || (ref_cell->ref_adj->nnode <= node0)) {
    local_2c = -1;
  }
  else {
    local_2c = ref_cell->ref_adj->first[node0];
  }
  cell = local_2c;
  if (local_2c == -1) {
    local_30 = 0xffffffff;
  }
  else {
    local_30 = ref_cell->ref_adj->item[local_2c].ref;
  }
  local_24 = local_30;
  while (cell != -1) {
    for (cell_node2 = 0; cell_node2 < ref_cell->node_per; cell_node2 = cell_node2 + 1) {
      if (node1 == ref_cell->c2n[(int)(cell_node2 + ref_cell->size_per * local_24)]) {
        printf("cell %d cell id %d\n",(ulong)local_24,
               (ulong)(uint)ref_cell->c2n[(int)(ref_cell->node_per + ref_cell->size_per * local_24)]
              );
        for (local_28 = 0; local_28 < ref_cell->node_per; local_28 = local_28 + 1) {
          printf(" %d",(ulong)(uint)ref_cell->c2n[(int)(local_28 + ref_cell->size_per * local_24)]);
        }
        printf(" %d\n",(ulong)(uint)ref_cell->c2n
                                    [(int)(ref_cell->node_per + ref_cell->size_per * local_24)]);
      }
    }
    cell = ref_cell->ref_adj->item[cell].next;
    if (cell == -1) {
      local_34 = 0xffffffff;
    }
    else {
      local_34 = ref_cell->ref_adj->item[cell].ref;
    }
    local_24 = local_34;
  }
  return;
}

Assistant:

static void ref_swap_tattle_nodes(REF_CELL ref_cell, REF_INT node0,
                                  REF_INT node1) {
  REF_INT item, cell_node, cell, cell_node2;
  each_ref_cell_having_node2(ref_cell, node0, node1, item, cell_node, cell) {
    printf("cell %d cell id %d\n", cell,
           ref_cell_c2n(ref_cell, ref_cell_id_index(ref_cell), cell));
    each_ref_cell_cell_node(ref_cell, cell_node2) {
      printf(" %d", ref_cell_c2n(ref_cell, cell_node2, cell));
    }
    printf(" %d\n", ref_cell_c2n(ref_cell, ref_cell_id_index(ref_cell), cell));
  }
}